

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O3

int HyperLogLog::TrailingZeroes(uint64_t fnv64)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint64_t v64;
  ulong uVar5;
  bool bVar6;
  
  lVar3 = 0;
  do {
    if ((fnv64 & 0xff) != 0) {
      bVar6 = (fnv64 & 0xf) != 0;
      uVar4 = (uint)lVar3 + 4;
      if (bVar6) {
        uVar4 = (uint)lVar3;
      }
      uVar5 = fnv64 & 0xffffffff;
      if (!bVar6) {
        uVar5 = (ulong)(((uint)fnv64 & 0xff) >> 4);
      }
      bVar2 = (byte)(uVar5 >> 2) & 0x3f;
      uVar1 = uVar4 | 2;
      if ((uVar5 & 3) != 0) {
        bVar2 = (byte)uVar5;
        uVar1 = uVar4;
      }
      return ~bVar2 & 1 | uVar1;
    }
    fnv64 = fnv64 >> 8;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x40);
  return 0x40;
}

Assistant:

int HyperLogLog::TrailingZeroes(uint64_t fnv64)
{
    int nb_zeroes = 0;
    uint64_t v64 = fnv64;
    for (size_t i = 0; i < 8; i++) {
        uint8_t v = (uint8_t)(v64 & 0xff);
        if (v == 0) {
            nb_zeroes += 8;
            v64 >>= 8;
            continue;
        }
        else {
            if ((v&0xf) == 0) {
                nb_zeroes += 4;
                v >>= 4;
            }
            if ((v&0x3) == 0) {
                nb_zeroes += 2;
                v >>= 2;
            }
            if ((v&0x1)== 0) {
                nb_zeroes += 1;
            }
            break;
        }
    }
    return nb_zeroes;
}